

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O0

int Ssw_ManSetConstrPhases(Aig_Man_t *p,int nFrames,Vec_Int_t **pvInits)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Int_t *pVVar4;
  Aig_Obj_t *pObj_00;
  int local_4c;
  int RetValue;
  int i;
  Aig_Obj_t *pObj;
  Cnf_Dat_t *pCnf;
  sat_solver *pSat;
  Aig_Man_t *pFrames;
  Vec_Int_t **pvInits_local;
  int nFrames_local;
  Aig_Man_t *p_local;
  
  if (pvInits != (Vec_Int_t **)0x0) {
    *pvInits = (Vec_Int_t *)0x0;
  }
  pAig = Ssw_FramesWithConstraints(p,nFrames);
  p_00 = Cnf_Derive(pAig,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  if (s == (sat_solver *)0x0) {
    Cnf_DataFree(p_00);
    Aig_ManStop(pAig);
    p_local._4_4_ = 1;
  }
  else {
    iVar2 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0);
    if ((iVar2 == 1) && (pvInits != (Vec_Int_t **)0x0)) {
      pVVar4 = Vec_IntAlloc(1000);
      *pvInits = pVVar4;
      for (local_4c = 0; iVar3 = Vec_PtrSize(pAig->vCis), local_4c < iVar3; local_4c = local_4c + 1)
      {
        pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,local_4c);
        pVVar4 = *pvInits;
        piVar1 = p_00->pVarNums;
        iVar3 = Aig_ObjId(pObj_00);
        iVar3 = sat_solver_var_value(s,piVar1[iVar3]);
        Vec_IntPush(pVVar4,iVar3);
      }
    }
    sat_solver_delete(s);
    Cnf_DataFree(p_00);
    Aig_ManStop(pAig);
    if (iVar2 == -1) {
      p_local._4_4_ = 1;
    }
    else if (iVar2 == 1) {
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = -1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Ssw_ManSetConstrPhases( Aig_Man_t * p, int nFrames, Vec_Int_t ** pvInits )
{
    Aig_Man_t * pFrames;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int i, RetValue;
    if ( pvInits )
        *pvInits = NULL;
//    assert( p->nConstrs > 0 );
    // derive the timeframes
    pFrames = Ssw_FramesWithConstraints( p, nFrames );
    // create CNF
    pCnf = Cnf_Derive( pFrames, 0 );
    // create SAT solver
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        Aig_ManStop( pFrames );
        return 1;
    }
    // solve
    RetValue = sat_solver_solve( pSat, NULL, NULL,
        (ABC_INT64_T)1000000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_True && pvInits )
    {
        *pvInits = Vec_IntAlloc( 1000 );
        Aig_ManForEachCi( pFrames, pObj, i )
            Vec_IntPush( *pvInits, sat_solver_var_value(pSat, pCnf->pVarNums[Aig_ObjId(pObj)]) );

//        Aig_ManForEachCi( pFrames, pObj, i )
//            Abc_Print( 1, "%d", Vec_IntEntry(*pvInits, i) );
//        Abc_Print( 1, "\n" );
    }
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Aig_ManStop( pFrames );
    if ( RetValue == l_False )
        return 1;
    if ( RetValue == l_True )
        return 0;
    return -1;
}